

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 col;
  float fVar4;
  byte local_a1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  float local_50;
  undefined1 auStack_4c [4];
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  char *type_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  register0x00000000 = &GImGui->DragDropPayload;
  if ((GImGui->DragDropActive & 1U) == 0) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2b09,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount != -1) {
    if ((type != (char *)0x0) && (bVar3 = ImGuiPayload::IsDataType(register0x00000000,type), !bVar3)
       ) {
      return (ImGuiPayload *)0x0;
    }
    r.Max.x._3_1_ = pIVar2->DragDropAcceptIdPrev == pIVar2->DragDropTargetId;
    _auStack_4c = (pIVar2->DragDropTargetRect).Min;
    r.Min = (pIVar2->DragDropTargetRect).Max;
    fVar4 = ImRect::GetWidth((ImRect *)auStack_4c);
    local_50 = ImRect::GetHeight((ImRect *)auStack_4c);
    local_50 = fVar4 * local_50;
    if (local_50 <= pIVar2->DragDropAcceptIdCurrRectSurface) {
      pIVar2->DragDropAcceptFlags = flags;
      pIVar2->DragDropAcceptIdCurr = pIVar2->DragDropTargetId;
      pIVar2->DragDropAcceptIdCurrRectSurface = local_50;
    }
    stack0xffffffffffffffc8->Preview = (bool)(r.Max.x._3_1_ & 1);
    if (((pIVar2->DragDropSourceFlags & 0x800U) == 0 && (flags & 0x800U) == 0) &&
       ((stack0xffffffffffffffc8->Preview & 1U) != 0)) {
      this = pIVar1->DrawList;
      ImVec2::ImVec2(&local_60,3.5,3.5);
      local_58 = operator-((ImVec2 *)auStack_4c,&local_60);
      ImVec2::ImVec2(&local_70,3.5,3.5);
      local_68 = operator+(&r.Min,&local_70);
      col = GetColorU32(0x32,1.0);
      ImDrawList::AddRect(this,&local_58,&local_68,col,0.0,0,2.0);
    }
    pIVar2->DragDropAcceptFrameCount = pIVar2->FrameCount;
    local_a1 = 0;
    if ((r.Max.x._3_1_ & 1) != 0) {
      bVar3 = IsMouseDown(pIVar2->DragDropMouseButton);
      local_a1 = bVar3 ^ 0xff;
    }
    stack0xffffffffffffffc8->Delivery = (bool)(local_a1 & 1);
    if (((stack0xffffffffffffffc8->Delivery & 1U) == 0) && ((flags & 0x400U) == 0)) {
      type_local = (char *)0x0;
    }
    else {
      type_local = (char *)stack0xffffffffffffffc8;
    }
    return (ImGuiPayload *)type_local;
  }
  __assert_fail("payload.DataFrameCount != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x2b0a,
                "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
               );
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}